

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputNodeVarType_abi_cxx11_(Node *this)

{
  Node *in_RSI;
  string local_70 [48];
  string local_40 [39];
  undefined1 local_19;
  Node *this_local;
  string *result;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  if ((in_RSI->Type == 0x204) || (in_RSI->Type == 0x207)) {
    genname(local_40);
    std::__cxx11::string::operator=((string *)this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    GetNodeVarType(in_RSI);
    OutputVarType_abi_cxx11_((VARTYPE)local_70);
    std::__cxx11::string::operator=((string *)this,local_70);
    std::__cxx11::string::~string(local_70);
  }
  return this;
}

Assistant:

std::string Node::OutputNodeVarType(void)
{
	std::string result;

	switch(Type)
	{
	case BAS_N_STRUCTNAME:
	case BAS_N_VARTYPE:
// FIXME: This needs attention, at least lower case the bloody name.
		result = genname(TextValue);
		break;

	default:
		result = OutputVarType(GetNodeVarType());
		break;
	}

	return result;
}